

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.cpp
# Opt level: O3

size_t first_word_end(string *str,size_t start)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  string chars;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\t\n\v\f\r ","");
  uVar1 = std::__cxx11::string::find_first_not_of((char *)str,(ulong)local_40[0],start);
  uVar2 = std::__cxx11::string::find_first_of((char *)str,(ulong)local_40[0],uVar1);
  uVar1 = str->_M_string_length;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  uVar3 = uVar1;
  if (uVar2 < uVar1) {
    uVar3 = uVar2;
  }
  if (uVar2 == 0xffffffffffffffff) {
    uVar3 = uVar1;
  }
  return uVar3;
}

Assistant:

size_t first_word_end(std::string& str, size_t start) {
  const std::string chars = "\t\n\v\f\r ";
  size_t next_word_start = str.find_first_not_of(chars, start);
  size_t next_word_end = str.find_first_of(chars, next_word_start);
  if (next_word_end == std::string::npos || next_word_end > str.size())
    return str.size();
  return next_word_end;
}